

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

void __thiscall
soul::SourceCodeUtilities::findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::
visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  uint32_t uVar1;
  SourceCodeText *o_00;
  SourceCodeText *pSVar2;
  uint32_t uVar3;
  char *pcVar4;
  
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  o_00 = (o->context).location.sourceCode.object;
  if (o_00 == (SourceCodeText *)0x0) {
    pcVar4 = (o->context).location.location.data;
    if (pcVar4 < *(char **)((long)this + 0x10)) goto LAB_001b1289;
    if (pcVar4 <= *(char **)((long)this + 0x20)) goto LAB_001b12d6;
  }
  else {
    uVar1 = (o_00->super_RefCountedObject).refCount;
    uVar3 = uVar1 + 1;
    (o_00->super_RefCountedObject).refCount = uVar3;
    pcVar4 = (o->context).location.location.data;
    if (pcVar4 < *(char **)((long)this + 0x10)) {
      (o_00->super_RefCountedObject).refCount = uVar1 + 2;
LAB_001b1289:
      pSVar2 = *(SourceCodeText **)((long)this + 8);
      *(SourceCodeText **)((long)this + 8) = o_00;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
      *(char **)((long)this + 0x10) = pcVar4;
      if (pcVar4 <= *(char **)((long)this + 0x20)) goto LAB_001b12d6;
      if (o_00 == (SourceCodeText *)0x0) goto LAB_001b12c7;
      uVar3 = (o_00->super_RefCountedObject).refCount;
    }
    else if (pcVar4 <= *(char **)((long)this + 0x20)) goto LAB_001b12d6;
    (o_00->super_RefCountedObject).refCount = uVar3 + 1;
  }
LAB_001b12c7:
  pSVar2 = *(SourceCodeText **)((long)this + 0x18);
  *(SourceCodeText **)((long)this + 0x18) = o_00;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
  *(char **)((long)this + 0x20) = pcVar4;
LAB_001b12d6:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }